

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_string *
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,xpath_node *na,xpath_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  uint uVar2;
  xml_node xVar3;
  char *pcVar4;
  xml_node xVar5;
  xml_node xVar6;
  char *pcVar7;
  xml_node cur;
  xml_node n;
  xml_node local_58;
  xml_node local_50;
  xpath_string local_48;
  
  pxVar1 = (na->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    xVar3 = xpath_node::node(na);
    if (xVar3._root != (xml_node_struct *)0x0) {
      uVar2 = (uint)(xVar3._root)->header & 0xf;
      if (uVar2 - 3 < 4) {
        pcVar4 = (xVar3._root)->value;
        goto LAB_0017fe1f;
      }
      if (uVar2 - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        pcVar4 = (xVar3._root)->value;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "";
        }
        local_50 = xVar3;
        if (*pcVar4 != '\0') {
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          local_48._buffer = pcVar4;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
        }
        xVar5 = xml_node::first_child(&local_50);
        local_58 = xVar5;
LAB_0017fedd:
        while( true ) {
          if (xVar5._root == (xml_node_struct *)0x0) {
            return __return_storage_ptr__;
          }
          if (xVar5._root == xVar3._root) {
            return __return_storage_ptr__;
          }
          if ((ulong)((uint)(xVar5._root)->header & 0xf) - 3 < 2) {
            local_48._buffer = (xVar5._root)->value;
            if (local_48._buffer == (char *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          xVar6 = xml_node::first_child(&local_58);
          if (xVar6._root == (xml_node_struct *)0x0) break;
          xVar5 = xml_node::first_child(&local_58);
          local_58 = xVar5;
        }
        xVar6 = xml_node::next_sibling(&local_58);
        if (xVar6._root == (xml_node_struct *)0x0) goto LAB_0017ff62;
        goto LAB_0017ff7d;
      }
    }
    __return_storage_ptr__->_buffer = "";
  }
  else {
    pcVar4 = pxVar1->value;
LAB_0017fe1f:
    pcVar7 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar7 = pcVar4;
    }
    __return_storage_ptr__->_buffer = pcVar7;
  }
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
LAB_0017ff62:
  while ((xVar6 = xml_node::next_sibling(&local_58), xVar6._root == (xml_node_struct *)0x0 &&
         (xVar5._root != xVar3._root))) {
    xVar5 = xml_node::parent(&local_58);
    local_58 = xVar5;
  }
  if (xVar5._root != xVar3._root) {
LAB_0017ff7d:
    xVar5 = xml_node::next_sibling(&local_58);
    local_58 = xVar5;
  }
  goto LAB_0017fedd;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}